

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.h
# Opt level: O2

void __thiscall
cnpy::NpyArray::NpyArray
          (NpyArray *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *_shape,
          size_t _word_size,char _type_code,bool _fortran_order)

{
  pointer puVar1;
  pointer puVar2;
  vector<char,_std::allocator<char>_> *this_00;
  ulong uVar3;
  size_t sVar4;
  allocator_type local_41;
  __shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  (this->data_holder).
  super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->data_holder).
  super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->shape,_shape);
  this->word_size = _word_size;
  this->type_code = _type_code;
  this->fortran_order = _fortran_order;
  this->num_vals = 1;
  puVar1 = (this->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar4 = 1;
  for (uVar3 = 0; uVar3 < (ulong)((long)puVar2 - (long)puVar1 >> 3); uVar3 = uVar3 + 1) {
    sVar4 = sVar4 * puVar1[uVar3];
    this->num_vals = sVar4;
  }
  this_00 = (vector<char,_std::allocator<char>_> *)operator_new(0x18);
  std::vector<char,_std::allocator<char>_>::vector(this_00,sVar4 * _word_size,&local_41);
  std::__shared_ptr<std::vector<char,std::allocator<char>>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::vector<char,std::allocator<char>>,void>
            ((__shared_ptr<std::vector<char,std::allocator<char>>,(__gnu_cxx::_Lock_policy)2> *)
             &local_40,this_00);
  std::__shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2> *)
             this,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

NpyArray(const std::vector<size_t>& _shape, size_t _word_size, char _type_code, bool _fortran_order) :
            shape(_shape), word_size(_word_size), type_code(_type_code), fortran_order(_fortran_order)
        {
            num_vals = 1;
            for(size_t i = 0;i < shape.size();i++) num_vals *= shape[i];
            data_holder = std::shared_ptr<std::vector<char>>(
                new std::vector<char>(num_vals * word_size));
        }